

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_operators.h
# Opt level: O2

Element_conflict __thiscall
Gudhi::persistence_fields::Multi_field_operators_with_small_characteristics::
get_partial_multiplicative_identity
          (Multi_field_operators_with_small_characteristics *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Element_conflict EVar7;
  
  if (*productOfCharacteristics == 0) {
    EVar7 = 1;
  }
  else {
    puVar3 = (this->primes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar1 = this->productOfAllCharacteristics_;
    EVar7 = 0;
    for (uVar5 = 0; uVar6 = (ulong)uVar5,
        uVar6 < (ulong)((long)(this->primes_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
        uVar5 = uVar5 + 1) {
      if (*productOfCharacteristics % puVar3[uVar6] == 0) {
        uVar2 = (this->partials_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6];
        uVar4 = uVar1;
        if (EVar7 + uVar2 < uVar1) {
          uVar4 = 0;
        }
        if (CARRY4(EVar7,uVar2)) {
          uVar4 = uVar1;
        }
        EVar7 = (EVar7 + uVar2) - uVar4;
      }
    }
  }
  return EVar7;
}

Assistant:

Element get_partial_multiplicative_identity(const Characteristic& productOfCharacteristics) const {
    if (productOfCharacteristics == 0) {
      return get_multiplicative_identity();
    }
    Element multIdentity = 0;
    for (unsigned int idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        multIdentity = _add(multIdentity, partials_[idx], productOfAllCharacteristics_);
      }
    }
    return multIdentity;
  }